

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::~TextureLevelCase
          (TextureLevelCase *this)

{
  pointer piVar1;
  pointer pTVar2;
  long *plVar3;
  void *pvVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pTVar6;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureLevelCase_021a2248;
  deinit(this);
  piVar1 = (this->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_failedIterations).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pTVar6 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar6 != pTVar2) {
    paVar5 = &(pTVar6->description).field_2;
    do {
      plVar3 = (long *)(((string *)(paVar5 + -1))->_M_dataplus)._M_p;
      if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
        operator_delete(plVar3,paVar5->_M_allocated_capacity + 1);
      }
      pvVar4 = *(void **)((long)paVar5 + -0x28);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)paVar5 + -0x18) - (long)pvVar4);
      }
      pTVar6 = (pointer)(paVar5 + 1);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar5 + 0x58);
    } while (pTVar6 != pTVar2);
  }
  pTVar6 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar6 != (pointer)0x0) {
    operator_delete(pTVar6,(long)(this->m_iterations).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar6);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TextureLevelCase::~TextureLevelCase (void)
{
	deinit();
}